

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::ActualConfigure(cmake *this)

{
  allocator<char> *__a;
  cmState *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  _Alloc_hider _Var3;
  undefined1 __p [8];
  bool bVar4;
  int iVar5;
  string *psVar6;
  cmValue cVar7;
  Status SVar8;
  cmValue cVar9;
  undefined1 auStack_d0 [7];
  allocator<char> local_c9;
  string fullName;
  bool local_a8;
  string message_4;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string local_70;
  allocator<char> local_49;
  string redirectsDir;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::operator+(&fullName,psVar6,"/CMakeFiles/CMakeScratch");
  cmsys::SystemTools::RemoveADirectory(&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  iVar5 = DoPreConfigureChecks(this);
  if (iVar5 < 0) {
    return -2;
  }
  if (iVar5 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&message_4);
    cVar7.Value = GetHomeDirectory_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&redirectsDir,
               "Source directory with the top level CMakeLists.txt file for this project",
               (allocator<char> *)(local_78 + 8));
    AddCacheEntry(this,&fullName,cVar7,&redirectsDir,4);
    std::__cxx11::string::~string((string *)&redirectsDir);
    std::__cxx11::string::~string((string *)&fullName);
  }
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[25]>
            (&redirectsDir,psVar6,(char (*) [25])"/CMakeFiles/pkgRedirects");
  cmsys::SystemTools::RemoveADirectory(&redirectsDir);
  SVar8 = cmsys::SystemTools::MakeDirectory(&redirectsDir,(mode_t *)0x0);
  if (SVar8.Kind_ != Success) {
    cmStrCat<char_const(&)[60],std::__cxx11::string_const&,char_const(&)[254]>
              (&fullName,
               (char (*) [60])"Unable to (re)create the private pkgRedirects directory:\n  ",
               &redirectsDir,
               (char (*) [254])
               "\nThis may be caused by not having read/write access to the build directory.\nTry specifying a location with read/write access like:\n  cmake -B build\nIf using a CMake presets file, ensure that preset parameter\n\'binaryDir\' expands to a writable directory.\n"
              );
    cmSystemTools::Error(&fullName);
LAB_002a6ec1:
    std::__cxx11::string::~string((string *)&fullName);
    iVar5 = -1;
    goto LAB_002a75cb;
  }
  __a = (allocator<char> *)(local_78 + 8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR",__a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message_4,"Value Computed by CMake.",(allocator<char> *)local_78);
  AddCacheEntry(this,&fullName,&redirectsDir,&message_4,5);
  std::__cxx11::string::~string((string *)&message_4);
  std::__cxx11::string::~string((string *)&fullName);
  if ((this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)&message_4);
    cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)&message_4);
    cVar9 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value != (string *)0x0) {
      if (cVar9.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&message_4,"",&local_49);
      }
      else {
        std::__cxx11::string::string((string *)&message_4,(string *)cVar9.Value);
      }
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&fullName,cVar7.Value,&message_4);
      std::__cxx11::string::~string((string *)&message_4);
      CreateGlobalGenerator((cmake *)&message_4,(string *)this,(bool)((char)auStack_d0 + '\b'));
      _Var3 = message_4._M_dataplus;
      message_4._M_dataplus._M_p = (pointer)0x0;
      pcVar2 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
           (cmGlobalGenerator *)_Var3._M_p;
      if ((pcVar2 != (cmGlobalGenerator *)0x0) &&
         ((*pcVar2->_vptr_cmGlobalGenerator[1])(), message_4._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)message_4._M_dataplus._M_p + 8))();
      }
      std::__cxx11::string::~string((string *)&fullName);
    }
    pcVar2 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    if (pcVar2 == (cmGlobalGenerator *)0x0) {
      CreateDefaultGlobalGenerator(this);
      if ((this->GlobalGenerator)._M_t.
          super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
          super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0
         ) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fullName,"Could not create generator",(allocator<char> *)&message_4);
        cmSystemTools::Error(&fullName);
        goto LAB_002a6ec1;
      }
    }
    else {
      cmSystemTools::s_ForceUnixPaths = pcVar2->ForceUnixPaths;
    }
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value != (string *)0x0) {
    pcVar2 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    iVar5 = (*pcVar2->_vptr_cmGlobalGenerator[4])(pcVar2,cVar7.Value);
    if ((char)iVar5 != '\0') goto LAB_002a7310;
    (*((this->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[3])
              (&message_4);
    local_70._M_dataplus._M_p._0_1_ = 10;
    local_78[0] = 10;
    cmStrCat<char_const(&)[20],std::__cxx11::string,char,char_const(&)[47],std::__cxx11::string_const&,char,char_const(&)[103]>
              (&fullName,(char (*) [20])"Error: generator : ",&message_4,local_78 + 8,
               (char (*) [47])"Does not match the generator used previously: ",cVar7.Value,
               (char *)local_78,
               (char (*) [103])
               "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
              );
    std::__cxx11::string::~string((string *)&message_4);
    cmSystemTools::Error(&fullName);
LAB_002a75be:
    std::__cxx11::string::~string((string *)&fullName);
    iVar5 = -2;
    goto LAB_002a75cb;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)local_78);
  (*((this->GlobalGenerator)._M_t.
     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
     super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[3])
            (&message_4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_78 + 8),"Name of generator.",&local_c9);
  AddCacheEntry(this,&fullName,&message_4,(string *)(local_78 + 8),4);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&message_4);
  std::__cxx11::string::~string((string *)&fullName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)local_78);
  cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
            (&message_4,
             (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_78 + 8),"Name of external makefile project generator.",&local_c9);
  AddCacheEntry(this,&fullName,&message_4,(string *)(local_78 + 8),4);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&message_4);
  std::__cxx11::string::~string((string *)&fullName);
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_TOOLCHAIN_FILE",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
    fullName._M_string_length = 0;
    fullName.field_2._M_local_buf[0] = '\0';
    bVar4 = cmsys::SystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE",&fullName);
    if (bVar4 && fullName._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message_4,"CMAKE_TOOLCHAIN_FILE",(allocator<char> *)local_78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_78 + 8),"The CMake toolchain file",&local_c9);
      AddCacheEntry(this,&message_4,&fullName,(string *)(local_78 + 8),2);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      std::__cxx11::string::~string((string *)&message_4);
    }
    std::__cxx11::string::~string((string *)&fullName);
  }
LAB_002a7310:
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)(local_78 + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_4,"Generator instance identifier.",(allocator<char> *)local_78);
    AddCacheEntry(this,&fullName,(cmValue)&this->GeneratorInstance,&message_4,4);
    std::__cxx11::string::~string((string *)&message_4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if (this->GeneratorInstanceSet == true) {
    bVar4 = std::operator!=(&this->GeneratorInstance,cVar7.Value);
    if (bVar4) {
      message_4._M_dataplus._M_p._0_1_ = 10;
      local_70._M_dataplus._M_p._0_1_ = 10;
      cmStrCat<char_const(&)[28],std::__cxx11::string&,char,char_const(&)[46],std::__cxx11::string_const&,char,char_const(&)[103]>
                (&fullName,(char (*) [28])"Error: generator instance: ",&this->GeneratorInstance,
                 (char *)&message_4,(char (*) [46])"Does not match the instance used previously: ",
                 cVar7.Value,(char *)__a,
                 (char (*) [103])
                 "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                );
      cmSystemTools::Error(&fullName);
      goto LAB_002a75be;
    }
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)(local_78 + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_4,"Name of generator platform.",(allocator<char> *)local_78);
    AddCacheEntry(this,&fullName,(cmValue)&this->GeneratorPlatform,&message_4,4);
    std::__cxx11::string::~string((string *)&message_4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if (this->GeneratorPlatformSet == true) {
    bVar4 = std::operator!=(&this->GeneratorPlatform,cVar7.Value);
    if (bVar4) {
      message_4._M_dataplus._M_p._0_1_ = 10;
      local_70._M_dataplus._M_p._0_1_ = 10;
      cmStrCat<char_const(&)[28],std::__cxx11::string&,char,char_const(&)[46],std::__cxx11::string_const&,char,char_const(&)[103]>
                (&fullName,(char (*) [28])"Error: generator platform: ",&this->GeneratorPlatform,
                 (char *)&message_4,(char (*) [46])"Does not match the platform used previously: ",
                 cVar7.Value,(char *)__a,
                 (char (*) [103])
                 "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                );
      cmSystemTools::Error(&fullName);
      goto LAB_002a75be;
    }
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)(local_78 + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_4,"Name of generator toolset.",(allocator<char> *)local_78);
    AddCacheEntry(this,&fullName,(cmValue)&this->GeneratorToolset,&message_4,4);
    std::__cxx11::string::~string((string *)&message_4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if (this->GeneratorToolsetSet == true) {
    bVar4 = std::operator!=(&this->GeneratorToolset,cVar7.Value);
    if (bVar4) {
      message_4._M_dataplus._M_p._0_1_ = 10;
      local_70._M_dataplus._M_p._0_1_ = 10;
      cmStrCat<char_const(&)[27],std::__cxx11::string&,char,char_const(&)[45],std::__cxx11::string_const&,char,char_const(&)[103]>
                (&fullName,(char (*) [27])"Error: generator toolset: ",&this->GeneratorToolset,
                 (char *)&message_4,(char (*) [45])"Does not match the toolset used previously: ",
                 cVar7.Value,(char *)__a,
                 (char (*) [103])
                 "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                );
      cmSystemTools::Error(&fullName);
      goto LAB_002a75be;
    }
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_TEST_LAUNCHER",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_4,"CMAKE_TEST_LAUNCHER",(allocator<char> *)(local_78 + 8));
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&fullName,&message_4);
    std::__cxx11::string::~string((string *)&message_4);
    if ((local_a8 == true) && (fullName._M_string_length != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message_4,"Test launcher to run tests executable.",
                 (allocator<char> *)(local_78 + 8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_78 + 8),"CMAKE_TEST_LAUNCHER",(allocator<char> *)local_78);
      AddCacheEntry(this,(string *)(local_78 + 8),&fullName,&message_4,3);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      std::__cxx11::string::~string((string *)&message_4);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&fullName);
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_CROSSCOMPILING_EMULATOR",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_4,"CMAKE_CROSSCOMPILING_EMULATOR",
               (allocator<char> *)(local_78 + 8));
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&fullName,&message_4);
    std::__cxx11::string::~string((string *)&message_4);
    if ((local_a8 == true) && (fullName._M_string_length != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message_4,"Emulator to run executables and tests when cross compiling.",
                 (allocator<char> *)(local_78 + 8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_78 + 8),"CMAKE_CROSSCOMPILING_EMULATOR",
                 (allocator<char> *)local_78);
      AddCacheEntry(this,(string *)(local_78 + 8),&fullName,&message_4,3);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      std::__cxx11::string::~string((string *)&message_4);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&fullName);
  }
  bVar4 = GetIsInTryCompile(this);
  if (!bVar4) {
    cmGlobalGenerator::ClearEnabledLanguages
              ((this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
  }
  message_4._M_dataplus._M_p = (pointer)this;
  std::make_unique<cmFileAPI,cmake*>((cmake **)&fullName);
  _Var3 = fullName._M_dataplus;
  fullName._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>::reset
            ((__uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_> *)&this->FileAPI,
             (pointer)_Var3._M_p);
  std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr
            ((unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> *)&fullName);
  cmFileAPI::ReadQueries
            ((this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>.
             _M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
             super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
  bVar4 = GetIsInTryCompile(this);
  if (!bVar4) {
    TruncateOutputLog(this,"CMakeConfigureLog.yaml");
    psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
    local_70._M_dataplus._M_p = (pointer)0xb;
    local_70._M_string_length = 0x6c19f8;
    cmStrCat<std::__cxx11::string_const&,cm::static_string_view>
              (&fullName,psVar6,(static_string_view *)(local_78 + 8));
    cmFileAPI::GetConfigureLogVersions
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&message_4,
               (this->FileAPI)._M_t.
               super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
               super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
               super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
    std::
    make_unique<cmConfigureLog,std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fullName);
    __p = local_78;
    local_78 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::reset
              ((__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)
               &this->ConfigureLog,(pointer)__p);
    std::unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::~unique_ptr
              ((unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)local_78);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&message_4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  (*((this->GlobalGenerator)._M_t.
     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
     super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[0xc])
            ();
  std::__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::reset
            ((__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)
             &this->ConfigureLog,(pointer)0x0);
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&message_4);
  cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (cVar7.Value != (string *)0x0) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator<char> *)&message_4);
    cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator<char> *)local_78);
      std::__cxx11::string::string<std::allocator<char>>((string *)&message_4,"",&local_c9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_78 + 8),"Single output directory for building all libraries.",
                 &local_79);
      AddCacheEntry(this,&fullName,&message_4,(string *)(local_78 + 8),1);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      std::__cxx11::string::~string((string *)&message_4);
      std::__cxx11::string::~string((string *)&fullName);
    }
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)&message_4);
    cVar7 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)local_78);
      std::__cxx11::string::string<std::allocator<char>>((string *)&message_4,"",&local_c9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_78 + 8),"Single output directory for building all executables.",
                 &local_79);
      AddCacheEntry(this,&fullName,&message_4,(string *)(local_78 + 8),1);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      std::__cxx11::string::~string((string *)&message_4);
      std::__cxx11::string::~string((string *)&fullName);
    }
  }
  this_00 = (cmMakefile *)
            **(undefined8 **)
              &(((this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->Makefiles).
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CTEST_USE_LAUNCHERS",(allocator<char> *)(local_78 + 8));
  bVar4 = cmMakefile::IsOn(this_00,&fullName);
  if (bVar4) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_4,"RULE_LAUNCH_COMPILE",(allocator<char> *)local_78);
    cVar7 = cmState::GetGlobalProperty(pcVar1,&message_4);
    std::__cxx11::string::~string((string *)&message_4);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,
                 "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                 ,(allocator<char> *)&message_4);
      cmSystemTools::Error(&fullName);
      goto LAB_002a7b70;
    }
  }
  else {
LAB_002a7b70:
    std::__cxx11::string::~string((string *)&fullName);
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  cmState::SaveVerificationScript
            (pcVar1,psVar6,
             (this->Messenger)._M_t.
             super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
             super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
             super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl);
  psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
  SaveCache(this,psVar6);
  bVar4 = cmSystemTools::GetErrorOccurredFlag();
  iVar5 = -(uint)bVar4;
LAB_002a75cb:
  std::__cxx11::string::~string((string *)&redirectsDir);
  return iVar5;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  cmSystemTools::RemoveADirectory(this->GetHomeOutputDirectory() +
                                  "/CMakeFiles/CMakeScratch");

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // We want to create the package redirects directory as early as possible,
  // but not before pre-configure checks have passed. This ensures we get
  // errors about inappropriate source/binary directories first.
  const auto redirectsDir =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles/pkgRedirects");
  cmSystemTools::RemoveADirectory(redirectsDir);
  if (!cmSystemTools::MakeDirectory(redirectsDir)) {
    cmSystemTools::Error(
      cmStrCat("Unable to (re)create the private pkgRedirects directory:\n  ",
               redirectsDir,
               "\n"
               "This may be caused by not having read/write access to "
               "the build directory.\n"
               "Try specifying a location with read/write access like:\n"
               "  cmake -B build\n"
               "If using a CMake presets file, ensure that preset parameter\n"
               "'binaryDir' expands to a writable directory.\n"));
    return -1;
  }
  this->AddCacheEntry("CMAKE_FIND_PACKAGE_REDIRECTS_DIR", redirectsDir,
                      "Value Computed by CMake.", cmStateEnums::STATIC);

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    cmValue extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message = cmStrCat(
        "Error: generator : ", this->GlobalGenerator->GetName(), '\n',
        "Does not match the generator used previously: ", *genName, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!genName) {
    this->AddCacheEntry("CMAKE_GENERATOR", this->GlobalGenerator->GetName(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry(
      "CMAKE_EXTRA_GENERATOR", this->GlobalGenerator->GetExtraGeneratorName(),
      "Name of external makefile project generator.", cmStateEnums::INTERNAL);

    if (!this->State->GetInitializedCacheValue("CMAKE_TOOLCHAIN_FILE")) {
      std::string envToolchain;
      if (cmSystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE", envToolchain) &&
          !envToolchain.empty()) {
        this->AddCacheEntry("CMAKE_TOOLCHAIN_FILE", envToolchain,
                            "The CMake toolchain file",
                            cmStateEnums::FILEPATH);
      }
    }
  }

  if (cmValue instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message = cmStrCat(
        "Error: generator instance: ", this->GeneratorInstance, '\n',
        "Does not match the instance used previously: ", *instance, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance,
                        "Generator instance identifier.",
                        cmStateEnums::INTERNAL);
  }

  if (cmValue platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = cmStrCat(
        "Error: generator platform: ", this->GeneratorPlatform, '\n',
        "Does not match the platform used previously: ", *platformName, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform,
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (cmValue tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message =
        cmStrCat("Error: generator toolset: ", this->GeneratorToolset, '\n',
                 "Does not match the toolset used previously: ", *tsName, '\n',
                 "Either remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset,
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  if (!this->State->GetInitializedCacheValue("CMAKE_TEST_LAUNCHER")) {
    cm::optional<std::string> testLauncher =
      cmSystemTools::GetEnvVar("CMAKE_TEST_LAUNCHER");
    if (testLauncher && !testLauncher->empty()) {
      std::string message = "Test launcher to run tests executable.";
      this->AddCacheEntry("CMAKE_TEST_LAUNCHER", *testLauncher, message,
                          cmStateEnums::STRING);
    }
  }

  if (!this->State->GetInitializedCacheValue(
        "CMAKE_CROSSCOMPILING_EMULATOR")) {
    cm::optional<std::string> emulator =
      cmSystemTools::GetEnvVar("CMAKE_CROSSCOMPILING_EMULATOR");
    if (emulator && !emulator->empty()) {
      std::string message =
        "Emulator to run executables and tests when cross compiling.";
      this->AddCacheEntry("CMAKE_CROSSCOMPILING_EMULATOR", *emulator, message,
                          cmStateEnums::STRING);
    }
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();
  }

#if !defined(CMAKE_BOOTSTRAP)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();

  if (!this->GetIsInTryCompile()) {
    this->TruncateOutputLog("CMakeConfigureLog.yaml");
    this->ConfigureLog = cm::make_unique<cmConfigureLog>(
      cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles"_s),
      this->FileAPI->GetConfigureLogVersions());
  }
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();

#if !defined(CMAKE_BOOTSTRAP)
  this->ConfigureLog.reset();
#endif

  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  const auto& mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory(),
                                      this->Messenger.get());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  return 0;
}